

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall
kj::Directory::tryTransfer
          (Directory *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,PathPtr fromPath
          ,TransferMode mode)

{
  bool bVar1;
  int iVar2;
  TransferMode TVar3;
  Fault f;
  Type local_60;
  
  if (toPath.parts.size_ == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x2cc,FAILED,"toPath.size() > 0","\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
  }
  else {
    TVar3 = mode;
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x15])
              (&f,fromDirectory,this);
    if ((char)f.exception == '\x01') {
      return (bool)f.exception._1_1_;
    }
    if (mode == MOVE) {
      iVar2 = (*(this->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x14])
                        (this,toPath.parts.ptr,toPath.parts.size_,(ulong)toMode,fromDirectory,2,
                         fromPath.parts.ptr._0_4_,(undefined4)fromPath.parts.size_,TVar3);
      if ((char)iVar2 == '\0') {
        return false;
      }
      remove(fromDirectory,(char *)fromPath.parts.ptr);
      return true;
    }
    if (mode != LINK) {
      if (mode != COPY) {
        _::unreachable();
      }
      (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[9])
                (&f,fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
      if ((char)f.exception != '\x01') {
        return false;
      }
      bVar1 = tryCopyDirectoryEntry
                        (this,toPath,toMode,&fromDirectory->super_ReadableDirectory,fromPath,
                         local_60,true);
      return bVar1;
    }
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x2e4,FAILED,(char *)0x0,
               "\"can\'t link across different Directory implementations\"",
               (char (*) [54])"can\'t link across different Directory implementations");
  }
  _::Debug::Fault::~Fault(&f);
  return false;
}

Assistant:

bool Directory::tryTransfer(PathPtr toPath, WriteMode toMode,
                            const Directory& fromDirectory, PathPtr fromPath,
                            TransferMode mode) const {
  KJ_REQUIRE(toPath.size() > 0, "can't replace self") { return false; }

  // First try reversing.
  KJ_IF_MAYBE(result, fromDirectory.tryTransferTo(*this, toPath, toMode, fromPath, mode)) {
    return *result;
  }

  switch (mode) {
    case TransferMode::COPY:
      KJ_IF_MAYBE(meta, fromDirectory.tryLstat(fromPath)) {
        return tryCopyDirectoryEntry(*this, toPath, toMode, fromDirectory,
                                     fromPath, meta->type, true);
      } else {
        // Source doesn't exist.
        return false;
      }
    case TransferMode::MOVE:
      // Implement move as copy-then-delete.
      if (!tryTransfer(toPath, toMode, fromDirectory, fromPath, TransferMode::COPY)) {
        return false;
      }
      fromDirectory.remove(fromPath);
      return true;
    case TransferMode::LINK:
      KJ_FAIL_REQUIRE("can't link across different Directory implementations") { return false; }
  }

  KJ_UNREACHABLE;
}